

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_ssadd64_mips(void *d,void *a,void *b,uint32_t desc)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = desc * 8 & 0xff;
  uVar4 = 0;
  do {
    uVar1 = *(ulong *)((long)a + uVar4);
    uVar2 = *(ulong *)((long)b + uVar4) + uVar1;
    uVar5 = 0x7fffffffffffffff;
    if (-1 < (long)uVar2) {
      uVar5 = 0x8000000000000000;
    }
    if (-1 < (long)((uVar2 ^ uVar1) & ~(*(ulong *)((long)b + uVar4) ^ uVar1))) {
      uVar5 = uVar2;
    }
    *(ulong *)((long)d + uVar4) = uVar5;
    uVar4 = uVar4 + 8;
  } while (uVar4 < uVar3 + 8);
  if (uVar3 < (desc >> 2 & 0xf8)) {
    helper_gvec_ssadd64_mips_cold_1();
  }
  return;
}

Assistant:

void HELPER(gvec_ssadd64)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int64_t)) {
        int64_t ai = *(int64_t *)((char *)a + i);
        int64_t bi = *(int64_t *)((char *)b + i);
        int64_t di = ai + bi;
        if (((di ^ ai) &~ (ai ^ bi)) < 0) {
            /* Signed overflow.  */
            di = (di < 0 ? INT64_MAX : INT64_MIN);
        }
        *(int64_t *)((char *)d + i) = di;
    }
    clear_high(d, oprsz, desc);
}